

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSense.c
# Opt level: O0

Vec_Int_t * Abc_NtkSensitivity(Abc_Ntk_t *pNtk,int nConfLim,int fVerbose)

{
  FILE *pFile;
  int iVar1;
  uint uVar2;
  uint uVar3;
  int *__ptr;
  int *pSimInfo;
  int i;
  int RetValue;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pMiter;
  Vec_Int_t *vResult;
  Prove_Params_t *pParams;
  Prove_Params_t Params;
  ProgressBar *pProgress;
  int fVerbose_local;
  int nConfLim_local;
  Abc_Ntk_t *pNtk_local;
  
  vResult = (Vec_Int_t *)&pParams;
  pMiter = (Abc_Ntk_t *)0x0;
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcSense.c"
                  ,0xa8,"Vec_Int_t *Abc_NtkSensitivity(Abc_Ntk_t *, int, int)");
  }
  iVar1 = Abc_NtkLatchNum(pNtk);
  if (iVar1 == 0) {
    Prove_ParamsSetDefault((Prove_Params_t *)vResult);
    vResult[1].nCap = 3;
    vResult[3].nSize = nConfLim;
    pMiter = (Abc_Ntk_t *)Vec_IntAlloc(100);
    pFile = _stdout;
    iVar1 = Abc_NtkCiNum(pNtk);
    Params.nTotalInspectsMade = (ABC_INT64_T)Extra_ProgressBarStart(pFile,iVar1);
    for (pSimInfo._0_4_ = 0; iVar1 = Abc_NtkCiNum(pNtk), (int)pSimInfo < iVar1;
        pSimInfo._0_4_ = (int)pSimInfo + 1) {
      Abc_NtkCi(pNtk,(int)pSimInfo);
      Extra_ProgressBarUpdate((ProgressBar *)Params.nTotalInspectsMade,(int)pSimInfo,(char *)0x0);
      pObj = (Abc_Obj_t *)Abc_NtkSensitivityMiter(pNtk,(int)pSimInfo);
      iVar1 = Abc_NtkIvyProve((Abc_Ntk_t **)&pObj,vResult);
      if (iVar1 == -1) {
        Vec_IntPush((Vec_Int_t *)pMiter,(int)pSimInfo);
      }
      else if (iVar1 == 0) {
        __ptr = Abc_NtkVerifySimulatePattern((Abc_Ntk_t *)pObj,*(int **)&pObj[4].Id);
        if (*__ptr != 1) {
          printf("ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n");
        }
        if (__ptr != (int *)0x0) {
          free(__ptr);
        }
        Vec_IntPush((Vec_Int_t *)pMiter,(int)pSimInfo);
      }
      Abc_NtkDelete((Abc_Ntk_t *)pObj);
    }
    Extra_ProgressBarStop((ProgressBar *)Params.nTotalInspectsMade);
    if (fVerbose != 0) {
      uVar2 = Vec_IntSize((Vec_Int_t *)pMiter);
      uVar3 = Abc_NtkCiNum(pNtk);
      printf("The outputs are sensitive to %d (out of %d) inputs:\n",(ulong)uVar2,(ulong)uVar3);
      for (pSimInfo._0_4_ = 0; iVar1 = Vec_IntSize((Vec_Int_t *)pMiter), (int)pSimInfo < iVar1;
          pSimInfo._0_4_ = (int)pSimInfo + 1) {
        uVar2 = Vec_IntEntry((Vec_Int_t *)pMiter,(int)pSimInfo);
        printf("%d ",(ulong)uVar2);
      }
      printf("\n");
    }
    return (Vec_Int_t *)pMiter;
  }
  __assert_fail("Abc_NtkLatchNum(pNtk) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcSense.c"
                ,0xa9,"Vec_Int_t *Abc_NtkSensitivity(Abc_Ntk_t *, int, int)");
}

Assistant:

Vec_Int_t * Abc_NtkSensitivity( Abc_Ntk_t * pNtk, int nConfLim, int fVerbose )
{
    ProgressBar * pProgress;
    Prove_Params_t Params, * pParams = &Params;
    Vec_Int_t * vResult = NULL;
    Abc_Ntk_t * pMiter;
    Abc_Obj_t * pObj;
    int RetValue, i;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkLatchNum(pNtk) == 0 );
    // set up solving parameters
    Prove_ParamsSetDefault( pParams );
    pParams->nItersMax = 3;
    pParams->nMiteringLimitLast = nConfLim;
    // iterate through the PIs
    vResult = Vec_IntAlloc( 100 );
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkCiNum(pNtk) );
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        // generate the sensitivity miter
        pMiter = Abc_NtkSensitivityMiter( pNtk, i );
        // solve the miter using CEC engine
        RetValue = Abc_NtkIvyProve( &pMiter, pParams );
        if ( RetValue == -1 ) // undecided
            Vec_IntPush( vResult, i );
        else if ( RetValue == 0 )
        {
            int * pSimInfo = Abc_NtkVerifySimulatePattern( pMiter, pMiter->pModel );
            if ( pSimInfo[0] != 1 )
                printf( "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n" );
//            else
//                printf( "Networks are NOT EQUIVALENT.\n" );
            ABC_FREE( pSimInfo );
            Vec_IntPush( vResult, i );
        }
        Abc_NtkDelete( pMiter );
    }
    Extra_ProgressBarStop( pProgress );
    if ( fVerbose )
    {
        printf( "The outputs are sensitive to %d (out of %d) inputs:\n", 
            Vec_IntSize(vResult), Abc_NtkCiNum(pNtk) );
        Vec_IntForEachEntry( vResult, RetValue, i )
            printf( "%d ", RetValue );
        printf( "\n" );
    }
    return vResult;
}